

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

string * __thiscall
pbrt::InstanceSceneEntity::ToString_abi_cxx11_
          (string *__return_storage_ptr__,InstanceSceneEntity *this)

{
  string local_50;
  
  if (this->renderFromInstance == (Transform *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"nullptr","");
  }
  else {
    Transform::ToString_abi_cxx11_(&local_50,this->renderFromInstance);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&,std::__cxx11::string>
            (__return_storage_ptr__,
             "[ InstanceSeneEntity name: %s loc: %s renderFromInstanceAnim: %s renderFromInstance: %s ]"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             &(this->super_SceneEntity).loc,&this->renderFromInstanceAnim,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ InstanceSeneEntity name: %s loc: %s "
            "renderFromInstanceAnim: %s renderFromInstance: %s ]",
            name, loc, renderFromInstanceAnim,
            renderFromInstance ? renderFromInstance->ToString() : std::string("nullptr"));
    }